

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonGroupInverse(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  long lVar1;
  bool bVar2;
  void *pvVar3;
  JsonString *pStr;
  char *z;
  int inStr;
  int i;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  bVar2 = false;
  pvVar3 = sqlite3_aggregate_context(ctx,0);
  if (pvVar3 != (void *)0x0) {
    lVar1 = *(long *)((long)pvVar3 + 8);
    z._4_4_ = 1;
    while (*(char *)(lVar1 + z._4_4_) != ',' || bVar2) {
      if (*(char *)(lVar1 + z._4_4_) == '\"') {
        bVar2 = (bool)(bVar2 ^ 1);
      }
      else if (*(char *)(lVar1 + z._4_4_) == '\\') {
        z._4_4_ = z._4_4_ + 1;
      }
      z._4_4_ = z._4_4_ + 1;
    }
    *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) - (long)z._4_4_;
    memmove((void *)(lVar1 + 1),(void *)(lVar1 + (z._4_4_ + 1)),*(long *)((long)pvVar3 + 0x18) - 1);
  }
  return;
}

Assistant:

static void jsonGroupInverse(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  int inStr = 0;
  char *z;
  JsonString *pStr;
  UNUSED_PARAM(argc);
  UNUSED_PARAM(argv);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, 0);
#ifdef NEVER
  /* pStr is always non-NULL since jsonArrayStep() or jsonObjectStep() will
  ** always have been called to initalize it */
  if( NEVER(!pStr) ) return;
#endif
  z = pStr->zBuf;
  for(i=1; z[i]!=',' || inStr; i++){
    assert( i<pStr->nUsed );
    if( z[i]=='"' ){
      inStr = !inStr;
    }else if( z[i]=='\\' ){
      i++;
    }
  }
  pStr->nUsed -= i;      
  memmove(&z[1], &z[i+1], (size_t)pStr->nUsed-1);
}